

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VWrmsNormMaskVectorArray(N_Vector X,sunindextype local_length,int myid)

{
  N_Vector X_00;
  undefined8 *i;
  uint in_EDX;
  N_Vector in_RDI;
  N_Vector *W;
  N_Vector *Z;
  sunrealtype nrm [3];
  sunrealtype fac;
  sunindextype global_length;
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double val;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  long local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  N_Vector local_8;
  
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_40 = N_VGetLength(in_RDI);
  if (0.0 < (double)(local_40 + -1) / (double)local_40) {
    val = sqrt((double)(local_40 + -1) / (double)local_40);
  }
  else {
    val = 0.0;
  }
  local_48 = val;
  X_00 = (N_Vector)N_VCloneVectorArray(3,local_8);
  i = (undefined8 *)N_VCloneVectorArray(3,local_8);
  N_VConst(0xbfe0000000000000,X_00->content);
  N_VConst(0x3fe0000000000000,*i);
  N_VConst(0x3ff0000000000000,local_8);
  if (local_14 == 0) {
    set_element(X_00,(sunindextype)i,val);
  }
  local_68 = -1.0;
  local_60 = -1.0;
  local_58 = -1.0;
  local_28 = get_time();
  local_20 = N_VWrmsNormMaskVectorArray(1,X_00,i,local_8,&local_68);
  sync_device(local_8);
  local_30 = get_time();
  if (local_20 == 0) {
    if (0.0 <= local_68) {
      local_84 = SUNRCompare(local_68,local_48 * 0.5 * 0.5);
    }
    else {
      local_84 = 1;
    }
    local_1c = local_84;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (local_14 == 0) {
      printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 1 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 1, Proc %d \n",(ulong)local_14);
    local_18 = local_18 + 1;
  }
  local_38 = max_time(local_8,local_30 - local_28);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VWrmsNormVectorArray");
  }
  N_VConst(0xbfe0000000000000,X_00->content);
  N_VConst(0x4010000000000000,X_00->ops);
  N_VConst(0x3fe0000000000000,X_00->sunctx);
  N_VConst(0x3fe0000000000000,*i);
  N_VConst(0x3fd0000000000000,i[1]);
  N_VConst(0x3ff0000000000000,i[2]);
  N_VConst(0x3ff0000000000000,local_8);
  if (local_14 == 0) {
    set_element(X_00,(sunindextype)i,val);
  }
  local_68 = -1.0;
  local_60 = -1.0;
  local_58 = -1.0;
  local_28 = get_time();
  local_20 = N_VWrmsNormMaskVectorArray(3,X_00,i,local_8,&local_68);
  sync_device(local_8);
  local_30 = get_time();
  if (local_20 == 0) {
    if (0.0 <= local_68) {
      local_88 = SUNRCompare(local_68,local_48 * 0.5 * 0.5);
    }
    else {
      local_88 = 1;
    }
    local_1c = local_88;
    if (0.0 <= local_60) {
      local_8c = SUNRCompare(local_60,local_48);
    }
    else {
      local_8c = 1;
    }
    local_1c = local_8c + local_1c;
    if (0.0 <= local_58) {
      local_90 = SUNRCompare(local_58,local_48 * 0.5);
    }
    else {
      local_90 = 1;
    }
    local_1c = local_90 + local_1c;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (local_14 == 0) {
      printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 2 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 2, Proc %d \n",(ulong)local_14);
    local_18 = local_18 + 1;
  }
  local_38 = max_time(local_8,local_30 - local_28);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VWrmsNormVectorArray");
  }
  N_VDestroyVectorArray(X_00,3);
  N_VDestroyVectorArray(i,3);
  return local_18;
}

Assistant:

int Test_N_VWrmsNormMaskVectorArray(N_Vector X, sunindextype local_length,
                                    int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;
  sunindextype global_length;

  sunrealtype fac;
  sunrealtype nrm[3];
  N_Vector* Z;
  N_Vector* W;

  /* get global length */
  global_length = N_VGetLength(X);

  /* factor used in checking solutions */
  fac = SUNRsqrt((sunrealtype)(global_length - 1) / (global_length));

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, X);
  W = N_VCloneVectorArray(3, X);

  /*
   * Case 1: nrm[0] = ||Z[0]||
   */

  /* fill vector data */
  N_VConst(NEG_HALF, Z[0]);
  N_VConst(HALF, W[0]);

  /* use all elements except one */
  N_VConst(ONE, X);
  if (myid == 0) { set_element(X, local_length - 1, ZERO); }

  nrm[0] = NEG_ONE;
  nrm[1] = NEG_ONE;
  nrm[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VWrmsNormMaskVectorArray(1, Z, W, X, nrm);
  sync_device(X);
  stop_time = get_time();

  /* nrm should equal fac/4 */
  if (ierr == 0)
  {
    failure = (nrm[0] < ZERO) ? 1 : SUNRCompare(nrm[0], fac * HALF * HALF);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNormVectorArray", maxt);

  /*
   * Case 2: nrm[i] = ||Z[i]||
   */

  /* fill vector data */
  N_VConst(NEG_HALF, Z[0]);
  N_VConst(TWO * TWO, Z[1]);
  N_VConst(HALF, Z[2]);

  N_VConst(HALF, W[0]);
  N_VConst(HALF * HALF, W[1]);
  N_VConst(ONE, W[2]);

  /* use all elements except one */
  N_VConst(ONE, X);
  if (myid == 0) { set_element(X, local_length - 1, ZERO); }

  nrm[0] = NEG_ONE;
  nrm[1] = NEG_ONE;
  nrm[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VWrmsNormMaskVectorArray(3, Z, W, X, nrm);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal fac/4, fac, fac/2] */
  if (ierr == 0)
  {
    failure = (nrm[0] < ZERO) ? 1 : SUNRCompare(nrm[0], fac * HALF * HALF);
    failure += (nrm[1] < ZERO) ? 1 : SUNRCompare(nrm[1], fac);
    failure += (nrm[2] < ZERO) ? 1 : SUNRCompare(nrm[2], fac * HALF);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 2, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNormVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(W, 3);

  return (fails);
}